

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void streamFile(char *filename)

{
  code *pcVar1;
  int iVar2;
  undefined8 *puVar3;
  xmlParserInputBufferPtr input;
  char *base;
  stat info;
  int fd;
  int ret;
  xmlTextReaderPtr reader;
  char *filename_local;
  
  info.__glibc_reserved[2]._0_4_ = -1;
  input = (xmlParserInputBufferPtr)0x0;
  if (memory == 0) {
    _fd = (xmlTextReaderPtr)xmlReaderForFile(filename,0,options);
  }
  else {
    iVar2 = stat64(filename,(stat64 *)&base);
    if (iVar2 < 0) {
      return;
    }
    info.__glibc_reserved[2]._0_4_ = open64(filename,0);
    if ((int)info.__glibc_reserved[2] < 0) {
      return;
    }
    input = (xmlParserInputBufferPtr)
            mmap64((void *)0x0,info.st_rdev,1,1,(int)info.__glibc_reserved[2],0);
    if (input == (xmlParserInputBufferPtr)0xffffffffffffffff) {
      close((int)info.__glibc_reserved[2]);
      fprintf(_stderr,"mmap failure for file %s\n",filename);
      progresult = XMLLINT_ERR_RDFILE;
      return;
    }
    _fd = (xmlTextReaderPtr)xmlReaderForMemory(input,info.st_rdev & 0xffffffff,filename,0,options);
  }
  if ((pattern != (char *)0x0) &&
     (patternc = (xmlPatternPtr)xmlPatterncompile(pattern,0,0), patternc == (xmlPatternPtr)0x0)) {
    puVar3 = (undefined8 *)__xmlGenericError();
    pcVar1 = (code *)*puVar3;
    puVar3 = (undefined8 *)__xmlGenericErrorContext();
    (*pcVar1)(*puVar3,"Pattern %s failed to compile\n",pattern);
    progresult = XMLLINT_ERR_SCHEMAPAT;
    pattern = (char *)0x0;
  }
  if (((patternc != (xmlPatternPtr)0x0) &&
      (patstream = (xmlStreamCtxtPtr)xmlPatternGetStreamCtxt(patternc),
      patstream != (xmlStreamCtxtPtr)0x0)) &&
     (info.__glibc_reserved[2]._4_4_ = xmlStreamPush(patstream,0),
     info.__glibc_reserved[2]._4_4_ < 0)) {
    fprintf(_stderr,"xmlStreamPush() failure\n");
    xmlFreeStreamCtxt(patstream);
    patstream = (xmlStreamCtxtPtr)0x0;
  }
  if (_fd == (xmlTextReaderPtr)0x0) {
    fprintf(_stderr,"Unable to open %s\n",filename);
    progresult = XMLLINT_ERR_UNCLASS;
  }
  else {
    if (valid == 0) {
      if (loaddtd != 0) {
        xmlTextReaderSetParserProp(_fd,1);
      }
    }
    else {
      xmlTextReaderSetParserProp(_fd,3,1);
    }
    if (relaxng != (char *)0x0) {
      if ((timing != 0) && (repeat == 0)) {
        startTimer();
      }
      info.__glibc_reserved[2]._4_4_ = xmlTextReaderRelaxNGValidate(_fd,relaxng);
      if (info.__glibc_reserved[2]._4_4_ < 0) {
        puVar3 = (undefined8 *)__xmlGenericError();
        pcVar1 = (code *)*puVar3;
        puVar3 = (undefined8 *)__xmlGenericErrorContext();
        (*pcVar1)(*puVar3,"Relax-NG schema %s failed to compile\n",relaxng);
        progresult = XMLLINT_ERR_SCHEMACOMP;
        relaxng = (char *)0x0;
      }
      if ((timing != 0) && (repeat == 0)) {
        endTimer("Compiling the schemas");
      }
    }
    if (schema != (char *)0x0) {
      if ((timing != 0) && (repeat == 0)) {
        startTimer();
      }
      info.__glibc_reserved[2]._4_4_ = xmlTextReaderSchemaValidate(_fd,schema);
      if (info.__glibc_reserved[2]._4_4_ < 0) {
        puVar3 = (undefined8 *)__xmlGenericError();
        pcVar1 = (code *)*puVar3;
        puVar3 = (undefined8 *)__xmlGenericErrorContext();
        (*pcVar1)(*puVar3,"XSD schema %s failed to compile\n",schema);
        progresult = XMLLINT_ERR_SCHEMACOMP;
        schema = (char *)0x0;
      }
      if ((timing != 0) && (repeat == 0)) {
        endTimer("Compiling the schemas");
      }
    }
    if ((timing != 0) && (repeat == 0)) {
      startTimer();
    }
    info.__glibc_reserved[2]._4_4_ = xmlTextReaderRead(_fd);
    while (info.__glibc_reserved[2]._4_4_ == 1) {
      if ((debug != 0) || (patternc != (xmlPatternPtr)0x0)) {
        processNode(_fd);
      }
      info.__glibc_reserved[2]._4_4_ = xmlTextReaderRead(_fd);
    }
    if ((timing != 0) && (repeat == 0)) {
      if (relaxng == (char *)0x0) {
        if (valid == 0) {
          endTimer("Parsing");
        }
        else {
          endTimer("Parsing and validating");
        }
      }
      else {
        endTimer("Parsing and validating");
      }
    }
    if ((valid != 0) && (iVar2 = xmlTextReaderIsValid(_fd), iVar2 != 1)) {
      puVar3 = (undefined8 *)__xmlGenericError();
      pcVar1 = (code *)*puVar3;
      puVar3 = (undefined8 *)__xmlGenericErrorContext();
      (*pcVar1)(*puVar3,"Document %s does not validate\n",filename);
      progresult = XMLLINT_ERR_VALID;
    }
    if ((relaxng != (char *)0x0) || (schema != (char *)0x0)) {
      iVar2 = xmlTextReaderIsValid(_fd);
      if (iVar2 == 1) {
        fprintf(_stderr,"%s validates\n",filename);
      }
      else {
        fprintf(_stderr,"%s fails to validate\n",filename);
        progresult = XMLLINT_ERR_VALID;
      }
    }
    xmlFreeTextReader(_fd);
    if (info.__glibc_reserved[2]._4_4_ != 0) {
      fprintf(_stderr,"%s : failed to parse\n",filename);
      progresult = XMLLINT_ERR_UNCLASS;
    }
  }
  if (patstream != (xmlStreamCtxtPtr)0x0) {
    xmlFreeStreamCtxt(patstream);
    patstream = (xmlStreamCtxtPtr)0x0;
  }
  if (memory != 0) {
    xmlFreeParserInputBuffer(0);
    munmap(input,info.st_rdev);
    close((int)info.__glibc_reserved[2]);
  }
  return;
}

Assistant:

static void streamFile(char *filename) {
    xmlTextReaderPtr reader;
    int ret;
#ifdef HAVE_MMAP
    int fd = -1;
    struct stat info;
    const char *base = NULL;
    xmlParserInputBufferPtr input = NULL;

    if (memory) {
	if (stat(filename, &info) < 0)
	    return;
	if ((fd = open(filename, O_RDONLY)) < 0)
	    return;
	base = mmap(NULL, info.st_size, PROT_READ, MAP_SHARED, fd, 0) ;
	if (base == (void *) MAP_FAILED) {
	    close(fd);
	    fprintf(stderr, "mmap failure for file %s\n", filename);
	    progresult = XMLLINT_ERR_RDFILE;
	    return;
	}

	reader = xmlReaderForMemory(base, info.st_size, filename,
	                            NULL, options);
    } else
#endif
	reader = xmlReaderForFile(filename, NULL, options);
#ifdef LIBXML_PATTERN_ENABLED
    if (pattern != NULL) {
        patternc = xmlPatterncompile((const xmlChar *) pattern, NULL, 0, NULL);
	if (patternc == NULL) {
	    xmlGenericError(xmlGenericErrorContext,
		    "Pattern %s failed to compile\n", pattern);
            progresult = XMLLINT_ERR_SCHEMAPAT;
	    pattern = NULL;
	}
    }
    if (patternc != NULL) {
        patstream = xmlPatternGetStreamCtxt(patternc);
	if (patstream != NULL) {
	    ret = xmlStreamPush(patstream, NULL, NULL);
	    if (ret < 0) {
		fprintf(stderr, "xmlStreamPush() failure\n");
		xmlFreeStreamCtxt(patstream);
		patstream = NULL;
            }
	}
    }
#endif


    if (reader != NULL) {
#ifdef LIBXML_VALID_ENABLED
	if (valid)
	    xmlTextReaderSetParserProp(reader, XML_PARSER_VALIDATE, 1);
	else
#endif /* LIBXML_VALID_ENABLED */
	    if (loaddtd)
		xmlTextReaderSetParserProp(reader, XML_PARSER_LOADDTD, 1);
#ifdef LIBXML_SCHEMAS_ENABLED
	if (relaxng != NULL) {
	    if ((timing) && (!repeat)) {
		startTimer();
	    }
	    ret = xmlTextReaderRelaxNGValidate(reader, relaxng);
	    if (ret < 0) {
		xmlGenericError(xmlGenericErrorContext,
			"Relax-NG schema %s failed to compile\n", relaxng);
		progresult = XMLLINT_ERR_SCHEMACOMP;
		relaxng = NULL;
	    }
	    if ((timing) && (!repeat)) {
		endTimer("Compiling the schemas");
	    }
	}
	if (schema != NULL) {
	    if ((timing) && (!repeat)) {
		startTimer();
	    }
	    ret = xmlTextReaderSchemaValidate(reader, schema);
	    if (ret < 0) {
		xmlGenericError(xmlGenericErrorContext,
			"XSD schema %s failed to compile\n", schema);
		progresult = XMLLINT_ERR_SCHEMACOMP;
		schema = NULL;
	    }
	    if ((timing) && (!repeat)) {
		endTimer("Compiling the schemas");
	    }
	}
#endif

	/*
	 * Process all nodes in sequence
	 */
	if ((timing) && (!repeat)) {
	    startTimer();
	}
	ret = xmlTextReaderRead(reader);
	while (ret == 1) {
	    if ((debug)
#ifdef LIBXML_PATTERN_ENABLED
	        || (patternc)
#endif
	       )
		processNode(reader);
	    ret = xmlTextReaderRead(reader);
	}
	if ((timing) && (!repeat)) {
#ifdef LIBXML_SCHEMAS_ENABLED
	    if (relaxng != NULL)
		endTimer("Parsing and validating");
	    else
#endif
#ifdef LIBXML_VALID_ENABLED
	    if (valid)
		endTimer("Parsing and validating");
	    else
#endif
	    endTimer("Parsing");
	}

#ifdef LIBXML_VALID_ENABLED
	if (valid) {
	    if (xmlTextReaderIsValid(reader) != 1) {
		xmlGenericError(xmlGenericErrorContext,
			"Document %s does not validate\n", filename);
		progresult = XMLLINT_ERR_VALID;
	    }
	}
#endif /* LIBXML_VALID_ENABLED */
#ifdef LIBXML_SCHEMAS_ENABLED
	if ((relaxng != NULL) || (schema != NULL)) {
	    if (xmlTextReaderIsValid(reader) != 1) {
		fprintf(stderr, "%s fails to validate\n", filename);
		progresult = XMLLINT_ERR_VALID;
	    } else {
		fprintf(stderr, "%s validates\n", filename);
	    }
	}
#endif
	/*
	 * Done, cleanup and status
	 */
	xmlFreeTextReader(reader);
	if (ret != 0) {
	    fprintf(stderr, "%s : failed to parse\n", filename);
	    progresult = XMLLINT_ERR_UNCLASS;
	}
    } else {
	fprintf(stderr, "Unable to open %s\n", filename);
	progresult = XMLLINT_ERR_UNCLASS;
    }
#ifdef LIBXML_PATTERN_ENABLED
    if (patstream != NULL) {
	xmlFreeStreamCtxt(patstream);
	patstream = NULL;
    }
#endif
#ifdef HAVE_MMAP
    if (memory) {
        xmlFreeParserInputBuffer(input);
	munmap((char *) base, info.st_size);
	close(fd);
    }
#endif
}